

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O0

w_status w_logger_deregister(w_logger logger_handle)

{
  int iVar1;
  wp_log_logger *local_20;
  wp_log_logger *logger;
  uint32_t local_10;
  w_status status;
  w_logger logger_handle_local;
  
  local_10 = logger_handle.handle;
  iVar1 = w_mtx_lock(&wp_log_mtx);
  if (iVar1 == 0) {
    logger._4_4_ = wp_log_logger_find(&local_20,local_10);
    if (logger._4_4_ == W_SUCCESS) {
      local_20->valid = 0;
    }
    iVar1 = w_mtx_unlock(&wp_log_mtx);
    if (iVar1 != 0) {
      logger._4_4_ = W_ERROR_UNLOCK_FAILED;
    }
    status = logger._4_4_;
  }
  else {
    status = W_ERROR_LOCK_FAILED;
  }
  return status;
}

Assistant:

enum w_status
w_logger_deregister(
    struct w_logger logger_handle
)
{
    enum w_status status;
    struct wp_log_logger *logger;

    if (w_mtx_lock(&wp_log_mtx) != 0)
    {
        return W_ERROR_LOCK_FAILED;
    }

    status = wp_log_logger_find(&logger, logger_handle.handle);
    if (status == W_SUCCESS)
    {
        logger->valid = 0;
    }

    if (w_mtx_unlock(&wp_log_mtx) != 0)
    {
        status = W_ERROR_UNLOCK_FAILED;
    }

    return status;
}